

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS_linux_common.cpp
# Opt level: O2

string * OS::trim(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  long lVar2;
  allocator local_41;
  string whitespace;
  
  std::__cxx11::string::string((string *)&whitespace," \t",&local_41);
  lVar1 = std::__cxx11::string::find_first_not_of((string *)str,(ulong)&whitespace);
  lVar2 = std::__cxx11::string::find_last_not_of((string *)str,(ulong)&whitespace);
  if (lVar1 == -1 || lVar2 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  std::__cxx11::string::~string((string *)&whitespace);
  return __return_storage_ptr__;
}

Assistant:

static std::string trim(const std::string& str)
{
    const std::string whitespace(" \t");
    const auto start = str.find_first_not_of(whitespace);
    const auto end = str.find_last_not_of(whitespace);

    if( start == std::string::npos || end == std::string::npos )
    {
        return "";
    }

    return str.substr(start, end - start + 1);
}